

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O2

void __thiscall EmmyDebuggerManager::Eval(EmmyDebuggerManager *this,shared_ptr<EvalContext> *ctx)

{
  shared_ptr<Debugger> debugger;
  __shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  Debugger *local_28;
  
  GetHitBreakpoint((EmmyDebuggerManager *)&stack0xffffffffffffffd8);
  if (local_28 != (Debugger *)0x0) {
    std::__shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_38,&ctx->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>);
    Debugger::Eval(local_28,(shared_ptr<EvalContext> *)&_Stack_38,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void EmmyDebuggerManager::Eval(std::shared_ptr<EvalContext> ctx)
{
	auto debugger = GetHitBreakpoint();
	if (debugger)
	{
		debugger->Eval(ctx, false);
	}
}